

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void initMemArray(Mem *p,int N,sqlite3 *db,u16 flags)

{
  u16 flags_local;
  sqlite3 *db_local;
  Mem *pMStack_10;
  int N_local;
  Mem *p_local;
  
  db_local._4_4_ = N;
  pMStack_10 = p;
  if (0 < N) {
    do {
      pMStack_10->flags = flags;
      pMStack_10->db = db;
      pMStack_10->szMalloc = 0;
      pMStack_10 = pMStack_10 + 1;
      db_local._4_4_ = db_local._4_4_ + -1;
    } while (0 < db_local._4_4_);
  }
  return;
}

Assistant:

static void initMemArray(Mem *p, int N, sqlite3 *db, u16 flags){
  if( N>0 ){
    do{
      p->flags = flags;
      p->db = db;
      p->szMalloc = 0;
#ifdef SQLITE_DEBUG
      p->pScopyFrom = 0;
#endif
      p++;
    }while( (--N)>0 );
  }
}